

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O1

void __thiscall
soplex::SPxBasisBase<double>::multBaseWith
          (SPxBasisBase<double> *this,SSVectorBase<double> *x,SSVectorBase<double> *result)

{
  int iVar1;
  pointer pdVar2;
  long lVar3;
  
  if (this->matrixIsSetup == false) {
    (*this->_vptr_SPxBasisBase[5])(this,&this->thedesc);
  }
  SSVectorBase<double>::clear(result);
  if (x->setupStatus == false) {
    pdVar2 = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(x->super_VectorBase<double>).val.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pdVar2) >> 3)) {
      lVar3 = 0;
      do {
        SSVectorBase<double>::multAdd<double,double>
                  (result,pdVar2[lVar3],(this->matrix).data[lVar3]);
        lVar3 = lVar3 + 1;
        pdVar2 = (x->super_VectorBase<double>).val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
      } while (lVar3 < (int)((ulong)((long)(x->super_VectorBase<double>).val.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2)
                            >> 3));
    }
  }
  else if (0 < (x->super_IdxSet).num) {
    lVar3 = 0;
    do {
      iVar1 = (x->super_IdxSet).idx[lVar3];
      SSVectorBase<double>::multAdd<double,double>
                (result,(x->super_VectorBase<double>).val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar1],(this->matrix).data[iVar1]);
      lVar3 = lVar3 + 1;
    } while (lVar3 < (x->super_IdxSet).num);
  }
  return;
}

Assistant:

void SPxBasisBase<R>::multBaseWith(SSVectorBase<R>& x, SSVectorBase<R>& result) const
{
   assert(status() > SINGULAR);
   assert(theLP->dim() == x.dim());
   assert(x.dim() == result.dim());

   if(!matrixIsSetup)
      (const_cast<SPxBasisBase<R>*>(this))->loadDesc(thedesc);

   assert(matrixIsSetup);

   result.clear();

   if(x.isSetup())
   {
      for(int i = 0; i < x.size(); ++i)
      {
         int idx = x.index(i);
         result.multAdd(x[idx], (*matrix[idx]));
      }
   }
   else
   {
      for(int i = 0; i < x.dim(); ++i)
         result.multAdd(x[i], (*matrix[i]));
   }

   return;
}